

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O3

void __thiscall QBoxLayout::insertLayout(QBoxLayout *this,int index,QLayout *layout,int stretch)

{
  QBoxLayoutPrivate *this_00;
  bool bVar1;
  int iVar2;
  QLayoutItem *pQVar3;
  long in_FS_OFFSET;
  QBoxLayoutItem *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QBoxLayoutPrivate **)&(this->super_QLayout).field_0x8;
  bVar1 = QLayoutPrivate::checkLayout(&this_00->super_QLayoutPrivate,layout);
  if (bVar1) {
    bVar1 = QLayout::adoptLayout(&this->super_QLayout,layout);
    if (bVar1) {
      iVar2 = QBoxLayoutPrivate::validateIndex(this_00,index);
      local_38 = (QBoxLayoutItem *)operator_new(0x10);
      pQVar3 = &layout->super_QLayoutItem;
      if (layout == (QLayout *)0x0) {
        pQVar3 = (QLayoutItem *)0x0;
      }
      local_38->item = pQVar3;
      local_38->stretch = stretch;
      local_38->magic = false;
      QtPrivate::QPodArrayOps<QBoxLayoutItem*>::emplace<QBoxLayoutItem*&>
                ((QPodArrayOps<QBoxLayoutItem*> *)&this_00->list,(long)iVar2,&local_38);
      QList<QBoxLayoutItem_*>::begin(&this_00->list);
      (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBoxLayout::insertLayout(int index, QLayout *layout, int stretch)
{
    Q_D(QBoxLayout);
    if (!d->checkLayout(layout))
        return;
    if (!adoptLayout(layout))
        return;
    index = d->validateIndex(index);
    QBoxLayoutItem *it = new QBoxLayoutItem(layout, stretch);
    d->list.insert(index, it);
    invalidate();
}